

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleWheelEvent(QWidgetWindow *this,QWheelEvent *event)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Data *pDVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  QWidget *pQVar9;
  QWidget *pQVar10;
  undefined8 uVar11;
  QWidget *pQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  qreal local_c8;
  qreal local_c0;
  QWheelEvent translated;
  qreal local_58;
  qreal qStack_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = QApplicationPrivate::modalState();
  if (bVar8) {
    pDVar5 = (this->m_widget).wp.d;
    if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
      pQVar12 = (QWidget *)0x0;
    }
    else {
      pQVar12 = (QWidget *)(this->m_widget).wp.value;
    }
    bVar8 = qt_try_modal(pQVar12,(uint)*(ushort *)(event + 8));
    if (!bVar8) goto LAB_00314b7a;
  }
  pDVar5 = (this->m_widget).wp.d;
  if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
    pQVar12 = (QWidget *)0x0;
  }
  else {
    pQVar12 = (QWidget *)(this->m_widget).wp.value;
  }
  QVar13 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_48.yp = QVar13.yp;
  local_48.xp = QVar13.xp;
  pQVar9 = QApplication::activePopupWidget();
  if (pQVar9 != (QWidget *)0x0) {
    pDVar5 = (this->m_widget).wp.d;
    if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
      pQVar10 = (QWidget *)0x0;
    }
    else {
      pQVar10 = (QWidget *)(this->m_widget).wp.value;
    }
    if (pQVar10 != pQVar9) {
      QVar13 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      _translated = (undefined1 *)QVar13.xp;
      QVar13 = QWidget::mapFromGlobal(pQVar9,(QPointF *)&translated);
      local_48.yp = QVar13.yp;
      local_48.xp = QVar13.xp;
      pQVar12 = pQVar9;
    }
  }
  pQVar9 = QWidget::childAt(pQVar12,&local_48);
  if (pQVar9 == (QWidget *)0x0) {
    pQVar9 = pQVar12;
  }
  local_58 = -NAN;
  qStack_50 = -NAN;
  QVar13 = QWidget::mapFrom(pQVar9,pQVar12,&local_48);
  qStack_50 = QVar13.yp;
  local_58 = QVar13.xp;
  _translated = &DAT_aaaaaaaaaaaaaaaa;
  QVar13 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  local_c0 = QVar13.yp;
  local_c8 = QVar13.xp;
  uVar6 = *(undefined8 *)(event + 0x50);
  uVar7 = *(undefined8 *)(event + 0x58);
  uVar2 = *(undefined4 *)(event + 0x20);
  uVar3 = *(undefined4 *)(event + 0x44);
  uVar1 = *(ushort *)(event + 0x4e);
  uVar4 = *(undefined4 *)(event + 0x48);
  uVar11 = QPointerEvent::pointingDevice();
  QWheelEvent::QWheelEvent
            (&translated,&local_58,&local_c8,uVar6,uVar7,uVar3,uVar2,uVar1 >> 0xc & 7,uVar1 >> 0xf,
             uVar4,uVar11);
  QPointerEvent::setTimestamp((ulonglong)&translated);
  QCoreApplication::forwardEvent(&pQVar9->super_QObject,(QEvent *)&translated,(QEvent *)event);
  QWheelEvent::~QWheelEvent(&translated);
LAB_00314b7a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleWheelEvent(QWheelEvent *event)
{
    if (QApplicationPrivate::instance()->modalState() && !qt_try_modal(m_widget, event->type()))
        return;

    QWidget *rootWidget = m_widget;
    QPointF pos = event->position();

    // Use proper popup window for wheel event. Some QPA sends the wheel
    // event to the root menu, so redirect it to the proper popup window.
    QWidget *activePopupWidget = QApplication::activePopupWidget();
    if (activePopupWidget && activePopupWidget != m_widget) {
        rootWidget = activePopupWidget;
        pos = rootWidget->mapFromGlobal(event->globalPosition());
    }

    // which child should have it?
    QWidget *widget = rootWidget->childAt(pos);

    if (!widget)
        widget = rootWidget;

    QPointF mapped = widget->mapFrom(rootWidget, pos);

    QWheelEvent translated(mapped, event->globalPosition(), event->pixelDelta(), event->angleDelta(),
                           event->buttons(), event->modifiers(), event->phase(), event->inverted(),
                           event->source(), event->pointingDevice());
    translated.setTimestamp(event->timestamp());
    QGuiApplication::forwardEvent(widget, &translated, event);
}